

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

int ggml::cpu::aarch64::repack<block_q4_0,8l,8l>(ggml_tensor *t,void *data,size_t data_size)

{
  undefined8 uVar1;
  ggml_half *pgVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  undefined8 *puVar10;
  ggml_half *pgVar11;
  int i;
  long lVar12;
  int64_t x;
  ulong uVar13;
  int i_1;
  undefined8 *puVar14;
  block_q4_0 *pbVar15;
  block_q4_0x8 out;
  block_q4_0 dst_tmp [8];
  
  if (t->type == GGML_TYPE_Q4_0) {
    pgVar11 = (ggml_half *)t->data;
    iVar3 = ggml_nrows();
    iVar4 = (int)(t->ne[0] / 0x20);
    if ((long)(iVar3 * iVar4) * 0x12 - data_size == 0) {
      if ((((uint)t->ne[0] | (uint)t->ne[1]) & 7) == 0) {
        uVar8 = (ulong)iVar4;
        iVar5 = 0;
        for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 8) {
          puVar10 = (undefined8 *)data;
          for (uVar13 = 0; uVar13 != (~((long)uVar8 >> 0x3f) & uVar8); uVar13 = uVar13 + 1) {
            puVar14 = puVar10;
            for (lVar12 = 0; lVar12 != 0x90; lVar12 = lVar12 + 0x12) {
              *(undefined2 *)(dst_tmp[0].qs + lVar12 + 0xe) = *(undefined2 *)(puVar14 + 2);
              uVar7 = *puVar14;
              uVar1 = puVar14[1];
              puVar14 = (undefined8 *)((long)puVar14 + uVar8 * 0x12);
              *(undefined8 *)(dst_tmp[0].qs + lVar12 + -2) = uVar7;
              *(undefined8 *)(dst_tmp[0].qs + lVar12 + 6) = uVar1;
            }
            pbVar15 = dst_tmp;
            for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
              pgVar2 = &pbVar15->d;
              pbVar15 = pbVar15 + 1;
              out.d[lVar12] = *pgVar2;
            }
            for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
              *(ulong *)(out.qs + lVar12 * 8) =
                   *(ulong *)(dst_tmp[(uint)lVar12 & 7].qs + ((uint)lVar12 & 8)) ^
                   0x8888888888888888;
            }
            puVar10 = (undefined8 *)((long)puVar10 + 0x12);
            *(undefined8 *)(pgVar11 + 0x28) = out.qs._64_8_;
            *(undefined8 *)(pgVar11 + 0x2c) = out.qs._72_8_;
            *(undefined8 *)(pgVar11 + 0x30) = out.qs._80_8_;
            *(undefined8 *)(pgVar11 + 0x34) = out.qs._88_8_;
            *(undefined8 *)(pgVar11 + 0x38) = out.qs._96_8_;
            *(undefined8 *)(pgVar11 + 0x3c) = out.qs._104_8_;
            *(undefined8 *)(pgVar11 + 0x40) = out.qs._112_8_;
            *(undefined8 *)(pgVar11 + 0x44) = out.qs._120_8_;
            *(undefined8 *)(pgVar11 + 0x20) = out.qs._48_8_;
            *(undefined8 *)(pgVar11 + 0x24) = out.qs._56_8_;
            *(undefined8 *)(pgVar11 + 0x28) = out.qs._64_8_;
            *(undefined8 *)(pgVar11 + 0x2c) = out.qs._72_8_;
            *(undefined8 *)(pgVar11 + 0x30) = out.qs._80_8_;
            *(undefined8 *)(pgVar11 + 0x34) = out.qs._88_8_;
            *(undefined8 *)(pgVar11 + 0x38) = out.qs._96_8_;
            *(undefined8 *)(pgVar11 + 0x3c) = out.qs._104_8_;
            *(undefined8 *)pgVar11 = out.d._0_8_;
            *(undefined8 *)(pgVar11 + 4) = out.d._8_8_;
            *(undefined8 *)(pgVar11 + 8) = out.qs._0_8_;
            *(undefined8 *)(pgVar11 + 0xc) = out.qs._8_8_;
            *(undefined8 *)(pgVar11 + 0x10) = out.qs._16_8_;
            *(undefined8 *)(pgVar11 + 0x14) = out.qs._24_8_;
            *(undefined8 *)(pgVar11 + 0x18) = out.qs._32_8_;
            *(undefined8 *)(pgVar11 + 0x1c) = out.qs._40_8_;
            pgVar11 = pgVar11 + 0x48;
          }
          data = (void *)((long)data + (long)(iVar4 * 8) * 0x12);
        }
      }
      else {
        iVar5 = -1;
      }
      return iVar5;
    }
    pcVar6 = "data_size == nrow * nblocks * sizeof(block_q4_0)";
    uVar7 = 0x16eb;
  }
  else {
    pcVar6 = "t->type == GGML_TYPE_Q4_0";
    uVar7 = 0x16e1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar7,"GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

static int repack_q4_0_to_q4_0_8_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_0);
    GGML_ASSERT(interleave_block == 8);
    constexpr int nrows_interleaved = 8;

    block_q4_0x8 * dst = (block_q4_0x8*)t->data;
    const block_q4_0 * src = (const block_q4_0*) data;
    block_q4_0 dst_tmp[8];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_0));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i  = 0; i < nrows_interleaved; i++ ) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_0x8(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}